

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptFunction::DeleteProperty
          (JavascriptFunction *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  PropertyRecord *pPVar3;
  DynamicTypeHandler *pDVar4;
  
  if (((propertyId | 2U) == 0x1cf) && (bVar1 = HasRestrictedProperties(this), bVar1)) {
    this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
               ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    pPVar3 = ScriptContext::GetPropertyName(this_00,propertyId);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,this_00,(PCWSTR)(pPVar3 + 1));
    return 0;
  }
  BVar2 = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
  if ((BVar2 != 0) && ((propertyId == 0x124 || (propertyId == 0x12)))) {
    InvalidateConstructorCacheOnPrototypeChange(this);
    ThreadContext::InvalidateIsInstInlineCachesForFunction
              (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary)
                 .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,this);
    if (propertyId == 0x124) {
      pDVar4 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
      pDVar4->flags = pDVar4->flags & 0xfd;
    }
  }
  return BVar2;
}

Assistant:

BOOL JavascriptFunction::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties())
            {
                JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
                return false;
            }
            break;
        }

        BOOL result = DynamicObject::DeleteProperty(propertyId, flags);

        if (result && (propertyId == PropertyIds::prototype || propertyId == PropertyIds::_symbolHasInstance))
        {
            InvalidateConstructorCacheOnPrototypeChange();
            this->GetScriptContext()->GetThreadContext()->InvalidateIsInstInlineCachesForFunction(this);
            if (propertyId == PropertyIds::prototype)
            {
                this->GetTypeHandler()->ClearHasKnownSlot0();
            }
        }

        return result;
    }